

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::Environment::RandomNewFree(Environment *this,BitGen *gen,size_t min_index)

{
  undefined1 local_30 [8];
  shared_ptr<const_upb::Arena> a;
  size_t min_index_local;
  BitGen *gen_local;
  Environment *this_local;
  
  a.super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)min_index;
  std::make_shared<upb::Arena_const>();
  SwapRandomArena(this,gen,(shared_ptr<const_upb::Arena> *)local_30,
                  (size_t)a.super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
  std::shared_ptr<const_upb::Arena>::~shared_ptr((shared_ptr<const_upb::Arena> *)local_30);
  return;
}

Assistant:

void RandomNewFree(absl::BitGen& gen, size_t min_index = 0) {
    auto a = std::make_shared<const upb::Arena>();
    SwapRandomArena(gen, a, min_index);
  }